

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O0

int compareWords2(void **x,void **y)

{
  void **y_local;
  void **x_local;
  
  if (**y < **x) {
    x_local._4_4_ = 1;
  }
  else if (**x < **y) {
    x_local._4_4_ = -1;
  }
  else {
    x_local._4_4_ = 0;
  }
  return x_local._4_4_;
}

Assistant:

int compareWords2 (const void ** x, const void ** y)
{
    
    if(**(word**)x > **(word**)y)
        return 1;
    else if(**(word**)x < **(word**)y)
        return -1;
    else
        return 0;   
    
}